

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_set_meta(fy_node *fyn,void *meta)

{
  fy_document *pfVar1;
  byte bVar2;
  int iVar3;
  
  iVar3 = -1;
  if ((fyn != (fy_node *)0x0) && (pfVar1 = fyn->fyd, iVar3 = -1, pfVar1 != (fy_document *)0x0)) {
    bVar2 = fyn->field_0x34;
    if (((bVar2 & 4) != 0) && (pfVar1->meta_clear_fn != (fy_node_meta_clear_fn)0x0)) {
      (*pfVar1->meta_clear_fn)(fyn,fyn->meta,pfVar1->meta_user);
      bVar2 = fyn->field_0x34;
    }
    fyn->meta = meta;
    fyn->field_0x34 = bVar2 | 4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int fy_node_set_meta(struct fy_node *fyn, void *meta) {
    struct fy_document *fyd;

    if (!fyn || !fyn->fyd)
        return -1;

    fyd = fyn->fyd;
    if (fyn->has_meta && fyd->meta_clear_fn)
        fyd->meta_clear_fn(fyn, fyn->meta, fyd->meta_user);
    fyn->meta = meta;
    fyn->has_meta = true;

    return 0;
}